

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

void __thiscall Chainstate::CheckForkWarningConditions(Chainstate *this)

{
  CBlockIndex *pCVar1;
  pointer ppCVar2;
  Notifications *pNVar3;
  bool bVar4;
  int i;
  ChainstateRole CVar5;
  int iVar6;
  base_uint<256U> *pbVar7;
  long lVar8;
  ulong uVar9;
  CBlockIndex *pCVar10;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  base_uint<256U> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  arith_uint256 local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  uint32_t *local_48;
  uint32_t auStack_40 [2];
  long local_38;
  uint32_t auStack_30 [2];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = ChainstateManager::IsInitialBlockDownload(this->m_chainman);
  if (!bVar4) {
    CVar5 = GetRole(this);
    if (CVar5 != BACKGROUND) {
      if (this->m_chainman->m_best_invalid != (CBlockIndex *)0x0) {
        pCVar1 = this->m_chainman->m_best_invalid;
        ppCVar2 = (this->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppCVar2 ==
            (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          pCVar10 = (CBlockIndex *)0x0;
        }
        else {
          pCVar10 = ppCVar2[-1];
        }
        GetBlockProof(&local_88,ppCVar2[-1]);
        local_c8.pn[4] = local_88.super_base_uint<256U>.pn[4];
        local_c8.pn[5] = local_88.super_base_uint<256U>.pn[5];
        local_c8.pn[6] = local_88.super_base_uint<256U>.pn[6];
        local_c8.pn[7] = local_88.super_base_uint<256U>.pn[7];
        local_c8.pn[0] = local_88.super_base_uint<256U>.pn[0];
        local_c8.pn[1] = local_88.super_base_uint<256U>.pn[1];
        local_c8.pn[2] = local_88.super_base_uint<256U>.pn[2];
        local_c8.pn[3] = local_88.super_base_uint<256U>.pn[3];
        pbVar7 = base_uint<256U>::operator*=(&local_c8,6);
        local_68 = *(undefined8 *)pbVar7->pn;
        uStack_60 = *(undefined8 *)(pbVar7->pn + 2);
        local_58 = *(undefined8 *)(pbVar7->pn + 4);
        uStack_50 = *(undefined8 *)(pbVar7->pn + 6);
        local_c8.pn._16_8_ = *(long *)((pCVar10->nChainWork).super_base_uint<256U>.pn + 4);
        local_c8.pn._24_8_ = *(undefined8 *)((pCVar10->nChainWork).super_base_uint<256U>.pn + 6);
        local_c8.pn._0_8_ = *(uint32_t **)(pCVar10->nChainWork).super_base_uint<256U>.pn;
        local_c8.pn._8_8_ = *(undefined8 *)((pCVar10->nChainWork).super_base_uint<256U>.pn + 2);
        lVar8 = 0;
        uVar9 = 0;
        do {
          uVar9 = (ulong)*(uint *)((long)&local_68 + lVar8 * 4) + local_c8.pn[lVar8] + uVar9;
          local_c8.pn[lVar8] = (uint32_t)uVar9;
          uVar9 = uVar9 >> 0x20;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        local_38._0_4_ = local_c8.pn[4];
        local_38._4_4_ = local_c8.pn[5];
        auStack_30[0] = local_c8.pn[6];
        auStack_30[1] = local_c8.pn[7];
        local_48 = (uint32_t *)local_c8.pn._0_8_;
        auStack_40[0] = local_c8.pn[2];
        auStack_40[1] = local_c8.pn[3];
        iVar6 = base_uint<256U>::CompareTo
                          (&(pCVar1->nChainWork).super_base_uint<256U>,(base_uint<256U> *)&local_48)
        ;
        if (0 < iVar6) {
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file._M_len = 0x5e;
          logging_function._M_str = "CheckForkWarningConditions";
          logging_function._M_len = 0x1a;
          LogPrintFormatInternal<char[27]>
                    (logging_function,source_file,0x7ed,ALL,Info,(ConstevalFormatString<1U>)0xfd3463
                     ,(char (*) [27])"CheckForkWarningConditions");
          pNVar3 = (this->m_chainman->m_options).notifications;
          local_c8.pn._0_8_ = local_c8.pn + 4;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,
                     "Warning: We do not appear to fully agree with our peers! You may need to upgrade, or other nodes may need to upgrade."
                     ,"");
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,
                       "Warning: We do not appear to fully agree with our peers! You may need to upgrade, or other nodes may need to upgrade."
                       ,"");
          }
          else {
            local_48 = (uint32_t *)0xfd34dc;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      (&local_a8,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_48);
          }
          (*pNVar3->_vptr_Notifications[5])(pNVar3,1,&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if ((uint32_t *)local_c8.pn._0_8_ != local_c8.pn + 4) {
            operator_delete((void *)local_c8.pn._0_8_,local_c8.pn._16_8_ + 1);
          }
          goto LAB_00aee1b2;
        }
      }
      pNVar3 = (this->m_chainman->m_options).notifications;
      (*pNVar3->_vptr_Notifications[6])(pNVar3,1);
    }
  }
LAB_00aee1b2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Chainstate::CheckForkWarningConditions()
{
    AssertLockHeld(cs_main);

    // Before we get past initial download, we cannot reliably alert about forks
    // (we assume we don't get stuck on a fork before finishing our initial sync)
    // Also not applicable to the background chainstate
    if (m_chainman.IsInitialBlockDownload() || this->GetRole() == ChainstateRole::BACKGROUND) {
        return;
    }

    if (m_chainman.m_best_invalid && m_chainman.m_best_invalid->nChainWork > m_chain.Tip()->nChainWork + (GetBlockProof(*m_chain.Tip()) * 6)) {
        LogPrintf("%s: Warning: Found invalid chain at least ~6 blocks longer than our best chain.\nChain state database corruption likely.\n", __func__);
        m_chainman.GetNotifications().warningSet(
            kernel::Warning::LARGE_WORK_INVALID_CHAIN,
            _("Warning: We do not appear to fully agree with our peers! You may need to upgrade, or other nodes may need to upgrade."));
    } else {
        m_chainman.GetNotifications().warningUnset(kernel::Warning::LARGE_WORK_INVALID_CHAIN);
    }
}